

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::CreateFunction(SQCompiler *this,SQObject *name,bool lambda)

{
  SQObjectType SVar1;
  SQFuncState *this_00;
  byte in_DL;
  SQCompiler *in_RDI;
  SQObject SVar2;
  bool in_stack_0000000f;
  SQCompiler *in_stack_00000010;
  SQFunctionProto *func;
  SQFuncState *currchunk;
  SQInteger n;
  SQInteger defparams;
  SQObject paramname;
  SQFuncState *funcstate;
  SQInteger in_stack_fffffffffffffef8;
  SQCompiler *in_stack_ffffffffffffff00;
  SQFuncState *pSVar3;
  SQSharedState *in_stack_ffffffffffffff08;
  SQObjectPtrVec *val;
  SQFuncState *in_stack_ffffffffffffff10;
  sqvector<SQObjectPtr> *this_01;
  SQInteger in_stack_ffffffffffffff18;
  SQInteger line;
  SQInteger in_stack_ffffffffffffff20;
  SQObject *in_stack_ffffffffffffff28;
  SQOpcode _op;
  SQFuncState *in_stack_ffffffffffffff30;
  SQInteger in_stack_ffffffffffffff38;
  SQFuncState *in_stack_ffffffffffffff50;
  sqvector<SQObjectPtr> local_a0;
  SQFuncState *local_88;
  long local_80;
  SQObjectType local_78;
  SQObjectValue local_70;
  SQObjectType local_68;
  SQObjectValue in_stack_ffffffffffffffa0;
  SQObjectType in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  long local_48;
  undefined4 in_stack_ffffffffffffffc4;
  
  this_00 = SQFuncState::PushChildState(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_ffffffffffffff10,(SQObject *)in_stack_ffffffffffffff08);
  pSVar3 = this_00;
  SVar2 = SQFuncState::CreateString
                    ((SQFuncState *)in_RDI,(SQChar *)this_00,in_stack_ffffffffffffff38);
  SVar1 = SVar2._type;
  SQFuncState::AddParameter(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_ffffffffffffff10,(SQObjectPtr *)in_stack_ffffffffffffff08);
  local_48 = 0;
  do {
    if (in_RDI->_token == 0x29) {
LAB_0012016d:
      SVar2 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0.nInteger);
      local_70 = SVar2._unVal;
      local_78 = SVar2._type;
      for (local_80 = 0; _op = (SQOpcode)((ulong)in_stack_ffffffffffffff28 >> 0x20),
          local_80 < local_48; local_80 = local_80 + 1) {
        SQFuncState::PopTarget(in_stack_ffffffffffffff10);
      }
      local_88 = in_RDI->_fs;
      in_RDI->_fs = this_00;
      if ((in_DL & 1) == 0) {
        Statement(in_stack_00000010,in_stack_0000000f);
      }
      else {
        Expression((SQCompiler *)CONCAT44(in_stack_ffffffffffffffc4,SVar1));
        _op = (SQOpcode)((ulong)in_RDI->_fs >> 0x20);
        SQFuncState::PopTarget(in_stack_ffffffffffffff10);
        SQFuncState::AddInstruction
                  (in_stack_ffffffffffffff30,_op,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18
                   ,(SQInteger)in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08);
      }
      if ((in_RDI->_lex)._prevtoken == 10) {
        line = (in_RDI->_lex)._lasttokenline;
      }
      else {
        line = (in_RDI->_lex)._currentline;
      }
      SQFuncState::AddLineInfos
                (this_00,line,SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),
                 SUB81((ulong)in_stack_ffffffffffffff10 >> 0x30,0));
      pSVar3 = (SQFuncState *)0x0;
      SQFuncState::AddInstruction
                (in_stack_ffffffffffffff30,_op,(SQInteger)this_00,line,
                 (SQInteger)in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08);
      SQFuncState::SetStackSize(in_stack_ffffffffffffff50,(SQInteger)in_RDI);
      local_a0._allocated = (SQUnsignedInteger)SQFuncState::BuildProto((SQFuncState *)n);
      in_RDI->_fs = local_88;
      val = &in_RDI->_fs->_functions;
      this_01 = &local_a0;
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_01,(SQFunctionProto *)local_a0._allocated);
      sqvector<SQObjectPtr>::push_back(this_01,(SQObjectPtr *)val);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)pSVar3);
      SQFuncState::PopChildState(pSVar3);
      return;
    }
    if (in_RDI->_token == 0x138) {
      if (0 < local_48) {
        Error(in_RDI,"function with default parameters cannot have variable number of parameters");
      }
      SVar2 = SQFuncState::CreateString((SQFuncState *)in_RDI,(SQChar *)pSVar3,(SQInteger)this_00);
      in_stack_ffffffffffffffa8 = SVar2._type;
      SQFuncState::AddParameter(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      this_00->_varparams = true;
      Lex(in_stack_ffffffffffffff00);
      if (in_RDI->_token != 0x29) {
        Error(in_RDI,"expected \')\'");
      }
      goto LAB_0012016d;
    }
    SVar2 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0.nInteger);
    in_stack_ffffffffffffffa0 = SVar2._unVal;
    local_68 = SVar2._type;
    SQFuncState::AddParameter(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (in_RDI->_token == 0x3d) {
      Lex(in_stack_ffffffffffffff00);
      Expression((SQCompiler *)CONCAT44(in_stack_ffffffffffffffc4,SVar1));
      in_stack_ffffffffffffff30 = this_00;
      SQFuncState::TopTarget((SQFuncState *)0x1200ec);
      SQFuncState::AddDefaultParam
                ((SQFuncState *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_48 = local_48 + 1;
    }
    else if (0 < local_48) {
      Error(in_RDI,"expected \'=\'");
    }
    if (in_RDI->_token == 0x2c) {
      Lex(in_stack_ffffffffffffff00);
    }
    else if (in_RDI->_token != 0x29) {
      Error(in_RDI,"expected \')\' or \',\'");
    }
  } while( true );
}

Assistant:

void CreateFunction(SQObject &name,bool lambda = false)
    {
        SQFuncState *funcstate = _fs->PushChildState(_ss(_vm));
        funcstate->_name = name;
        SQObject paramname;
        funcstate->AddParameter(_fs->CreateString(_SC("this")));
        funcstate->_sourcename = _sourcename;
        SQInteger defparams = 0;
        while(_token!=_SC(')')) {
            if(_token == TK_VARPARAMS) {
                if(defparams > 0) Error(_SC("function with default parameters cannot have variable number of parameters"));
                funcstate->AddParameter(_fs->CreateString(_SC("vargv")));
                funcstate->_varparams = true;
                Lex();
                if(_token != _SC(')')) Error(_SC("expected ')'"));
                break;
            }
            else {
                paramname = Expect(TK_IDENTIFIER);
                funcstate->AddParameter(paramname);
                if(_token == _SC('=')) {
                    Lex();
                    Expression();
                    funcstate->AddDefaultParam(_fs->TopTarget());
                    defparams++;
                }
                else {
                    if(defparams > 0) Error(_SC("expected '='"));
                }
                if(_token == _SC(',')) Lex();
                else if(_token != _SC(')')) Error(_SC("expected ')' or ','"));
            }
        }
        Expect(_SC(')'));
        for(SQInteger n = 0; n < defparams; n++) {
            _fs->PopTarget();
        }

        SQFuncState *currchunk = _fs;
        _fs = funcstate;
        if(lambda) {
            Expression();
            _fs->AddInstruction(_OP_RETURN, 1, _fs->PopTarget());}
        else {
            Statement(false);
        }
        funcstate->AddLineInfos(_lex._prevtoken == _SC('\n')?_lex._lasttokenline:_lex._currentline, _lineinfo, true);
        funcstate->AddInstruction(_OP_RETURN, -1);
        funcstate->SetStackSize(0);

        SQFunctionProto *func = funcstate->BuildProto();
#ifdef _DEBUG_DUMP
        funcstate->Dump(func);
#endif
        _fs = currchunk;
        _fs->_functions.push_back(func);
        _fs->PopChildState();
    }